

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-features.h
# Opt level: O0

string * __thiscall
wasm::FeatureSet::toString_abi_cxx11_(string *__return_storage_ptr__,FeatureSet *this,Feature f)

{
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  Feature f_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 != 0) {
    if (local_14 == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"threads",&local_15);
      std::allocator<char>::~allocator(&local_15);
    }
    else if (local_14 == 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"mutable-globals",local_25);
      std::allocator<char>::~allocator(local_25);
    }
    else if (local_14 == 4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"nontrapping-float-to-int",&local_26);
      std::allocator<char>::~allocator(&local_26);
    }
    else if (local_14 == 8) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"simd",&local_27);
      std::allocator<char>::~allocator(&local_27);
    }
    else if (local_14 == 0x10) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"bulk-memory",&local_28);
      std::allocator<char>::~allocator(&local_28);
    }
    else if (local_14 == 0x20) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"sign-ext",&local_29);
      std::allocator<char>::~allocator(&local_29);
    }
    else {
      if (local_14 == 0x22) goto LAB_0016e8f2;
      if (local_14 == 0x40) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"exception-handling",&local_2a);
        std::allocator<char>::~allocator(&local_2a);
      }
      else if (local_14 == 0x80) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"tail-call",&local_2b);
        std::allocator<char>::~allocator(&local_2b);
      }
      else if (local_14 == 0x100) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"reference-types",&local_2c);
        std::allocator<char>::~allocator(&local_2c);
      }
      else if (local_14 == 0x200) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"multivalue",&local_2d);
        std::allocator<char>::~allocator(&local_2d);
      }
      else if (local_14 == 0x400) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"gc",&local_2e);
        std::allocator<char>::~allocator(&local_2e);
      }
      else if (local_14 == 0x800) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"memory64",&local_2f);
        std::allocator<char>::~allocator(&local_2f);
      }
      else if (local_14 == 0x1000) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"relaxed-simd",&local_30);
        std::allocator<char>::~allocator(&local_30);
      }
      else if (local_14 == 0x2000) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"extended-const",&local_31);
        std::allocator<char>::~allocator(&local_31);
      }
      else if (local_14 == 0x4000) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"strings",&local_32);
        std::allocator<char>::~allocator(&local_32);
      }
      else if (local_14 == 0x8000) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"multimemory",&local_33);
        std::allocator<char>::~allocator(&local_33);
      }
      else if (local_14 == 0x10000) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"stack-switching",&local_34);
        std::allocator<char>::~allocator(&local_34);
      }
      else if (local_14 == 0x20000) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"shared-everything",&local_35);
        std::allocator<char>::~allocator(&local_35);
      }
      else if (local_14 == 0x40000) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"fp16",&local_36);
        std::allocator<char>::~allocator(&local_36);
      }
      else if (local_14 == 0x80000) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"bulk-memory-opt",&local_37);
        std::allocator<char>::~allocator(&local_37);
      }
      else if (local_14 == 0x100000) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"call-indirect-overlong",&local_38);
        std::allocator<char>::~allocator(&local_38);
      }
      else {
        if (local_14 != 0x200000) goto LAB_0016e8f2;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"custom-descriptors",&local_39);
        std::allocator<char>::~allocator(&local_39);
      }
    }
    return __return_storage_ptr__;
  }
LAB_0016e8f2:
  wasm::handle_unreachable
            ("unexpected feature",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-features.h"
             ,0x74);
}

Assistant:

static std::string toString(Feature f) {
    switch (f) {
      case Atomics:
        return "threads";
      case MutableGlobals:
        return "mutable-globals";
      case TruncSat:
        return "nontrapping-float-to-int";
      case SIMD:
        return "simd";
      case BulkMemory:
        return "bulk-memory";
      case SignExt:
        return "sign-ext";
      case ExceptionHandling:
        return "exception-handling";
      case TailCall:
        return "tail-call";
      case ReferenceTypes:
        return "reference-types";
      case Multivalue:
        return "multivalue";
      case GC:
        return "gc";
      case Memory64:
        return "memory64";
      case RelaxedSIMD:
        return "relaxed-simd";
      case ExtendedConst:
        return "extended-const";
      case Strings:
        return "strings";
      case MultiMemory:
        return "multimemory";
      case StackSwitching:
        return "stack-switching";
      case SharedEverything:
        return "shared-everything";
      case FP16:
        return "fp16";
      case BulkMemoryOpt:
        return "bulk-memory-opt";
      case CallIndirectOverlong:
        return "call-indirect-overlong";
      case CustomDescriptors:
        return "custom-descriptors";
      case MVP:
      case Default:
      case All:
        break;
    }
    WASM_UNREACHABLE("unexpected feature");
  }